

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O0

int invertMatrixTest(void)

{
  ostream *poVar1;
  void *pvVar2;
  Index in_RCX;
  Index cols;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_240;
  XprTypeNested local_230;
  undefined1 local_228 [8];
  Matrix4 hi;
  type local_170;
  Type local_158;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_11b;
  undefined1 local_118 [8];
  Matrix4 h;
  undefined1 local_90 [8];
  Matrix3 R1;
  Quaternion<double,0> local_28 [8];
  Quaternion q;
  
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,4,1,0,4,1>>
            ((type *)(R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 8),(ProbabilityLawSimulation *)0x4,1,in_RCX,-1.0,1.0);
  Eigen::Quaternion<double,0>::Quaternion<Eigen::Matrix<double,4,1,0,4,1>>
            (local_28,(MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                      (R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array + 8));
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::normalize
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)local_28);
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            ((RotationMatrixType *)local_90,
             (RotationBase<Eigen::Quaternion<double,_0>,_3> *)local_28);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((Matrix<double,4,4,0,4,4> *)local_118,&local_11b);
  cols = 0;
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            (&local_158,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_118,0,0,3,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_158,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_90);
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_170,(ProbabilityLawSimulation *)0x3,1,cols,-1.0,1.0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<int,int>
            ((Type *)(hi.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0xf),(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_118,0,
             3,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)
             (hi.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_170);
  stateObservation::kine::invertHomoMatrix((Matrix4 *)local_228,(Matrix4 *)local_118);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_118);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_228);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_230 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                        ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_118);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                             &local_230);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_240 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_228,
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_118);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                              *)&local_240);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int invertMatrixTest() // tested OK
{
  stateObservation::Quaternion q(tools::ProbabilityLawSimulation::getUniformMatrix<Vector4>());

  q.normalize();

  Matrix3 R1(q.matrix());

  Matrix4 h(Matrix4::Identity());

  h.block(0, 0, 3, 3) = R1;
  h.block(0, 3, 3, 1) = tools::ProbabilityLawSimulation::getUniformMatrix<Vector3>();

  Matrix4 hi = kine::invertHomoMatrix(h);

  std::cout << h << std::endl << std::endl;
  std::cout << hi << std::endl << std::endl;
  std::cout << h.inverse() << std::endl << std::endl;
  std::cout << hi * h << std::endl << std::endl;
  return 0;
}